

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_predict_hbd_c(int16_t *ac_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bit_depth,
                      int width,int height)

{
  uint16_t uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  int i;
  int j;
  undefined4 local_28;
  int bd;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (bd = 0; bd < width; bd = bd + 1) {
    for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
      get_scaled_luma_q0(in_ECX,*(int16_t *)(local_8 + (long)local_28 * 2));
      uVar1 = clip_pixel_highbd(in_R9D,bd);
      *(uint16_t *)(local_10 + (long)local_28 * 2) = uVar1;
    }
    local_10 = local_10 + (long)in_EDX * 2;
    local_8 = local_8 + 0x40;
  }
  return;
}

Assistant:

static inline void cfl_predict_hbd_c(const int16_t *ac_buf_q3, uint16_t *dst,
                                     int dst_stride, int alpha_q3,
                                     int bit_depth, int width, int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel_highbd(
          get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i], bit_depth);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}